

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::operator==
          (Directed_Energy_Fire_PDU *this,Directed_Energy_Fire_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  KBOOL KVar3;
  pointer pKVar4;
  StandardVariable **ppSVar5;
  bool bVar6;
  
  KVar3 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar3) &&
       (KVar3 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_FiringEntityID,&Value->m_FiringEntityID), !KVar3)) &&
      (KVar3 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID), !KVar3))
     && ((KVar3 = DATA_TYPE::EntityType::operator!=(&this->m_MunTyp,&Value->m_MunTyp), !KVar3 &&
         (KVar3 = DATA_TYPE::ClockTime::operator!=(&this->m_ShotStartTime,&Value->m_ShotStartTime),
         !KVar3)))) {
    if (((float)this->m_f32CumulativeShotTime == (float)Value->m_f32CumulativeShotTime) &&
       ((!NAN((float)this->m_f32CumulativeShotTime) && !NAN((float)Value->m_f32CumulativeShotTime)
        && (KVar3 = DATA_TYPE::Vector::operator!=(&this->m_EmitterLoc,&Value->m_EmitterLoc), !KVar3)
        ))) {
      if (((float)this->m_f32AperDiameter == (float)Value->m_f32AperDiameter) &&
         (!NAN((float)this->m_f32AperDiameter) && !NAN((float)Value->m_f32AperDiameter))) {
        if (((float)this->m_f32Wavelength == (float)Value->m_f32Wavelength) &&
           (!NAN((float)this->m_f32Wavelength) && !NAN((float)Value->m_f32Wavelength))) {
          if (((float)this->m_f32PeakIrradiance == (float)Value->m_f32PeakIrradiance) &&
             (!NAN((float)this->m_f32PeakIrradiance) && !NAN((float)Value->m_f32PeakIrradiance))) {
            if (((float)this->m_f32PulseRepFreq == (float)Value->m_f32PulseRepFreq) &&
               (!NAN((float)this->m_f32PulseRepFreq) && !NAN((float)Value->m_f32PulseRepFreq))) {
              if (((float)this->m_f32PulseWidth == (float)Value->m_f32PulseWidth) &&
                 ((((!NAN((float)this->m_f32PulseWidth) && !NAN((float)Value->m_f32PulseWidth) &&
                    ((this->m_DeUnion).m_ui16Flags == (Value->m_DeUnion).m_ui16Flags)) &&
                   (this->m_ui8PulseShp == Value->m_ui8PulseShp)) &&
                  (this->m_ui16NumDERecs == Value->m_ui16NumDERecs)))) {
                pKVar1 = (this->m_vDeRec).
                         super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pKVar2 = (this->m_vDeRec).
                         super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pKVar4 = (Value->m_vDeRec).
                         super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((long)pKVar2 - (long)pKVar1 ==
                    (long)(Value->m_vDeRec).
                          super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar4) {
                  if (pKVar1 == pKVar2) {
                    return true;
                  }
                  ppSVar5 = &pKVar4->m_pRef;
                  do {
                    pKVar4 = pKVar1 + 1;
                    bVar6 = pKVar1->m_pRef == *ppSVar5;
                    if (!bVar6) {
                      return bVar6;
                    }
                    ppSVar5 = ppSVar5 + 3;
                    pKVar1 = pKVar4;
                  } while (pKVar4 != pKVar2);
                  return bVar6;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

KBOOL Directed_Energy_Fire_PDU::operator == ( const Directed_Energy_Fire_PDU & Value ) const
{
    if( Header::operator        !=( Value ) )                      return false;
    if( m_FiringEntityID        != Value.m_FiringEntityID )        return false;
    if( m_EventID               != Value.m_EventID )               return false;
    if( m_MunTyp                != Value.m_MunTyp )                return false;
    if( m_ShotStartTime         != Value.m_ShotStartTime )         return false;
    if( m_f32CumulativeShotTime != Value.m_f32CumulativeShotTime ) return false;
    if( m_EmitterLoc            != Value.m_EmitterLoc )            return false;
    if( m_f32AperDiameter       != Value.m_f32AperDiameter )       return false;
    if( m_f32Wavelength         != Value.m_f32Wavelength )         return false;
    if( m_f32PeakIrradiance     != Value.m_f32PeakIrradiance )     return false;
    if( m_f32PulseRepFreq       != Value.m_f32PulseRepFreq )       return false;
    if( m_f32PulseWidth         != Value.m_f32PulseWidth )         return false;
    if( m_DeUnion.m_ui16Flags   != Value.m_DeUnion.m_ui16Flags )   return false;
    if( m_ui8PulseShp           != Value.m_ui8PulseShp )           return false;
    if( m_ui16NumDERecs         != Value.m_ui16NumDERecs )         return false;
    if( m_vDeRec                != Value.m_vDeRec )                return false;
    return true;
}